

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

opj_bool j2k_read_cbd(opj_j2k_v2_t *p_j2k,OPJ_BYTE *p_header_data,OPJ_UINT32 p_header_size,
                     opj_event_mgr *p_manager)

{
  opj_event_mgr_t *in_RCX;
  int in_EDX;
  OPJ_BYTE *in_RSI;
  long in_RDI;
  opj_image_comp_t *l_comp;
  OPJ_UINT32 i;
  OPJ_UINT32 l_comp_def;
  OPJ_UINT32 l_num_comp;
  OPJ_UINT32 l_nb_comp;
  long local_40;
  uint local_38;
  uint local_34;
  uint local_30;
  uint local_2c;
  opj_event_mgr_t *local_28;
  OPJ_BYTE *local_18;
  long local_10;
  opj_bool local_4;
  
  local_30 = *(uint *)(*(long *)(in_RDI + 0x60) + 0x10);
  if (in_EDX == *(int *)(*(long *)(in_RDI + 0x60) + 0x10) + 2) {
    local_28 = in_RCX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    opj_read_bytes_LE(in_RSI,&local_2c,2);
    local_18 = local_18 + 2;
    if (local_2c == local_30) {
      local_40 = *(long *)(*(long *)(local_10 + 0x60) + 0x18);
      for (local_38 = 0; local_38 < local_30; local_38 = local_38 + 1) {
        opj_read_bytes_LE(local_18,&local_34,1);
        local_18 = local_18 + 1;
        *(uint *)(local_40 + 0x20) = local_34 >> 7 & 1;
        *(uint *)(local_40 + 0x18) = (local_34 & 0x7f) + 1;
        local_40 = local_40 + 0x38;
      }
      local_4 = 1;
    }
    else {
      opj_event_msg_v2(local_28,1,"Crror reading CBD marker\n");
      local_4 = 0;
    }
  }
  else {
    opj_event_msg_v2(in_RCX,1,"Crror reading CBD marker\n");
    local_4 = 0;
  }
  return local_4;
}

Assistant:

opj_bool j2k_read_cbd (	opj_j2k_v2_t *p_j2k,
						OPJ_BYTE * p_header_data,
						OPJ_UINT32 p_header_size,
						struct opj_event_mgr * p_manager)
{
	OPJ_UINT32 l_nb_comp,l_num_comp;
	OPJ_UINT32 l_comp_def;
	OPJ_UINT32 i;
	opj_image_comp_t * l_comp = 00;

	/* preconditions */
	assert(p_header_data != 00);
	assert(p_j2k != 00);
	assert(p_manager != 00);

	l_num_comp = p_j2k->m_private_image->numcomps;

	if (p_header_size != (p_j2k->m_private_image->numcomps + 2)) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Crror reading CBD marker\n");
		return OPJ_FALSE;
	}

	opj_read_bytes(p_header_data,&l_nb_comp,2);				/* Ncbd */
	p_header_data+=2;

	if (l_nb_comp != l_num_comp) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Crror reading CBD marker\n");
		return OPJ_FALSE;
	}

	l_comp = p_j2k->m_private_image->comps;
	for (i=0;i<l_num_comp;++i) {
		opj_read_bytes(p_header_data,&l_comp_def,1);			/* Component bit depth */
		++p_header_data;
        l_comp->sgnd = (l_comp_def>>7) & 1;
		l_comp->prec = (l_comp_def&0x7f) + 1;
		++l_comp;
	}

	return OPJ_TRUE;
}